

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_music.cpp
# Opt level: O0

MusInfo * I_RegisterURLSong(char *url)

{
  uint uVar1;
  StreamSong *song;
  char *url_local;
  
  url_local = (char *)operator_new(0x18);
  StreamSong::StreamSong((StreamSong *)url_local,url);
  uVar1 = (*(((StreamSong *)url_local)->super_MusInfo)._vptr_MusInfo[10])();
  if ((uVar1 & 1) == 0) {
    if ((StreamSong *)url_local != (StreamSong *)0x0) {
      (*(((StreamSong *)url_local)->super_MusInfo)._vptr_MusInfo[1])();
    }
    url_local = (char *)0x0;
  }
  return (MusInfo *)url_local;
}

Assistant:

MusInfo *I_RegisterURLSong (const char *url)
{
	StreamSong *song;

	song = new StreamSong(url);
	if (song->IsValid())
	{
		return song;
	}
	delete song;
	return NULL;
}